

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

Script * __thiscall
cfd::core::Psbt::GetTxInRedeemScriptDirect
          (Script *__return_storage_ptr__,Psbt *this,uint32_t index,bool ignore_error,
          bool is_witness)

{
  undefined8 uVar1;
  string *in_stack_ffffffffffffff30;
  ByteData *pBVar2;
  undefined8 in_stack_ffffffffffffff38;
  CfdError error_code;
  Script *this_00;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  ByteData local_68;
  ByteData local_40;
  void *local_28;
  wally_psbt *psbt_pointer;
  bool is_witness_local;
  bool ignore_error_local;
  Psbt *pPStack_18;
  uint32_t index_local;
  Psbt *this_local;
  
  error_code = (CfdError)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  this_00 = __return_storage_ptr__;
  psbt_pointer._2_1_ = is_witness;
  psbt_pointer._3_1_ = ignore_error;
  psbt_pointer._4_4_ = index;
  pPStack_18 = this;
  this_local = (Psbt *)__return_storage_ptr__;
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xa4f,"GetTxInRedeemScriptDirect");
  local_28 = this->wally_psbt_pointer_;
  if (((psbt_pointer._2_1_ & 1) == 0) ||
     (*(long *)(*(long *)((long)local_28 + 0x10) + (ulong)psbt_pointer._4_4_ * 0x110 + 0x20) == 0))
  {
    if (((psbt_pointer._2_1_ & 1) == 0) &&
       (*(long *)(*(long *)((long)local_28 + 0x10) + (ulong)psbt_pointer._4_4_ * 0x110 + 0x10) != 0)
       ) {
      pBVar2 = &local_68;
      ByteData::ByteData(pBVar2,*(uint8_t **)
                                 (*(long *)((long)local_28 + 0x10) + 0x10 +
                                 (ulong)psbt_pointer._4_4_ * 0x110),
                         *(uint32_t *)
                          (*(long *)((long)local_28 + 0x10) + 0x18 +
                          (ulong)psbt_pointer._4_4_ * 0x110));
      Script::Script(this_00,pBVar2);
      ByteData::~ByteData((ByteData *)0x477b71);
    }
    else {
      if ((psbt_pointer._3_1_ & 1) == 0) {
        local_80.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_80.filename = local_80.filename + 1;
        local_80.line = 0xa61;
        local_80.funcname = "GetTxInRedeemScriptDirect";
        logger::warn<>(&local_80,"script not found.");
        uVar1 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_a0,"psbt script not found error.",&local_a1);
        CfdException::CfdException((CfdException *)this_00,error_code,in_stack_ffffffffffffff30);
        __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
      }
      Script::Script(this_00);
    }
  }
  else {
    pBVar2 = &local_40;
    ByteData::ByteData(pBVar2,*(uint8_t **)
                               (*(long *)((long)local_28 + 0x10) + 0x20 +
                               (ulong)psbt_pointer._4_4_ * 0x110),
                       *(uint32_t *)
                        (*(long *)((long)local_28 + 0x10) + 0x28 + (ulong)psbt_pointer._4_4_ * 0x110
                        ));
    Script::Script(this_00,pBVar2);
    ByteData::~ByteData((ByteData *)0x477ae3);
  }
  return __return_storage_ptr__;
}

Assistant:

Script Psbt::GetTxInRedeemScriptDirect(
    uint32_t index, bool ignore_error, bool is_witness) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (is_witness && (psbt_pointer->inputs[index].witness_script != nullptr)) {
    return Script(ByteData(
        psbt_pointer->inputs[index].witness_script,
        static_cast<uint32_t>(
            psbt_pointer->inputs[index].witness_script_len)));
  } else if (
      (!is_witness) &&
      (psbt_pointer->inputs[index].redeem_script != nullptr)) {
    return Script(ByteData(
        psbt_pointer->inputs[index].redeem_script,
        static_cast<uint32_t>(psbt_pointer->inputs[index].redeem_script_len)));
  } else if (ignore_error) {
    return Script();
  } else {
    warn(CFD_LOG_SOURCE, "script not found.");
    throw CfdException(kCfdIllegalStateError, "psbt script not found error.");
  }
}